

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

bool kratos::is_valid_verilog
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *src)

{
  size_type *psVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  undefined1 local_50 [8];
  string final_src;
  
  psVar1 = &final_src._M_string_length;
  final_src._M_dataplus._M_p = (pointer)0x0;
  final_src._M_string_length._0_1_ = 0;
  p_Var3 = (src->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(src->_M_t)._M_impl.super__Rb_tree_header;
  local_50 = (undefined1  [8])psVar1;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      std::__cxx11::string::_M_append(local_50,*(ulong *)(p_Var3 + 2));
      std::__cxx11::string::append(local_50);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  bVar2 = is_valid_verilog((string *)local_50);
  if (local_50 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_50,
                    CONCAT71(final_src._M_string_length._1_7_,(undefined1)final_src._M_string_length
                            ) + 1);
  }
  return bVar2;
}

Assistant:

bool is_valid_verilog(const std::map<std::string, std::string> &src) {
    std::string final_src;
    for (auto const &iter : src) {
        final_src.append(iter.second);
        final_src.append("\n");
    }
    return is_valid_verilog(final_src);
}